

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyFromDescriptor<true,int>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          Var originalInstance,DictionaryPropertyDescriptor<unsigned_short> *descriptor,Var *value,
          PropertyValueInfo *info,int propertyT,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  unsigned_short uVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  JavascriptLibrary *this_00;
  RecyclableObject *func;
  unsigned_short dataSlot;
  bool isLetConstGlobal;
  PropertyValueInfo *info_local;
  Var *value_local;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  if ((descriptor->Attributes & 0x10) != 0) {
    bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x202,"(!isLetConstGlobal || VarIs<RootObjectBase>(instance))",
                                  "object must be a global object if letconstglobal is set");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if (((descriptor->Attributes & 0x10) == 0) && ((descriptor->Attributes & 8) != 0)) {
    this_local._4_4_ = 0;
  }
  else {
    uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(descriptor);
    if (uVar3 == 0xffff) {
      uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
      if (uVar3 == 0xffff) {
        this_00 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
        pRVar6 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        *value = pRVar6;
        this_local._4_4_ = 1;
      }
      else {
        uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
        SetPropertyValueInfoNonFixed
                  (this,info,&instance->super_RecyclableObject,uVar3,descriptor->Attributes,
                   InlineCacheNoFlags);
        CacheOperators::CachePropertyReadForGetter(info,originalInstance,propertyT,requestContext);
        PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
        uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
        pvVar5 = DynamicObject::GetSlot(instance,(uint)uVar3);
        pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
        pvVar5 = Js::JavascriptOperators::CallGetter(pRVar6,originalInstance,requestContext);
        *value = pvVar5;
        this_local._4_4_ = 1;
      }
    }
    else {
      pvVar5 = DynamicObject::GetSlot(instance,(uint)uVar3);
      *value = pvVar5;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,uVar3,descriptor);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetPropertyFromDescriptor(DynamicObject* instance, Var originalInstance,
        DictionaryPropertyDescriptor<T>* descriptor, Var* value, PropertyValueInfo* info, PropertyType propertyT, ScriptContext* requestContext)
    {
        bool const isLetConstGlobal = (descriptor->Attributes & PropertyLetConstGlobal) != 0;
        AssertMsg(!isLetConstGlobal || VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
        if (allowLetConstGlobal)
        {
            // GetRootProperty: false if not global
            if (!(descriptor->Attributes & PropertyLetConstGlobal) && (descriptor->Attributes & PropertyDeleted))
            {
                return false;
            }
        }
        else
        {
            // GetProperty: don't count deleted or global.
            if (descriptor->Attributes & (PropertyDeleted | (descriptor->GetIsShadowed() ? 0 : PropertyLetConstGlobal)))
            {
                return false;
            }
        }

        T dataSlot = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlot != NoSlots)
        {
            *value = instance->GetSlot(dataSlot);
            SetPropertyValueInfo(info, instance, dataSlot, descriptor);
        }
        else if (descriptor->GetGetterPropertyIndex() != NoSlots)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetGetterPropertyIndex(), descriptor->Attributes);
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyT, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(descriptor->GetGetterPropertyIndex()));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
            return true;
        }
        return true;
    }